

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
           *this,field_type to_move,
          btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  field_type fVar5;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
  *pbVar7;
  byte local_2a;
  byte local_29;
  field_type i_1;
  field_type i;
  allocator_type *alloc_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
  *right_local;
  field_type to_move_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>
  *this_local;
  
  pbVar6 = parent(this);
  pbVar7 = parent(right);
  if (pbVar6 != pbVar7) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x738,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x739,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                 );
  }
  bVar1 = count(right);
  bVar2 = count(this);
  if (bVar1 < bVar2) {
    __assert_fail("right->count() >= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x73a,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                 );
  }
  if (to_move == '\0') {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x73b,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                 );
  }
  bVar1 = count(right);
  if (bVar1 < to_move) {
    __assert_fail("to_move <= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x73c,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                 );
  }
  bVar1 = finish(this);
  bVar2 = position(this);
  pbVar6 = parent(this);
  transfer(this,(ulong)bVar1,(ulong)bVar2,pbVar6,alloc);
  bVar1 = finish(this);
  bVar2 = start(right);
  transfer_n(this,(long)(int)(to_move - 1),(long)(int)(bVar1 + 1),(ulong)bVar2,right,alloc);
  pbVar6 = parent(this);
  bVar1 = position(this);
  bVar2 = start(right);
  transfer(pbVar6,(ulong)bVar1,(long)(int)((uint)bVar2 + (uint)to_move + -1),right,alloc);
  bVar1 = count(right);
  bVar2 = start(right);
  bVar3 = start(right);
  transfer_n(right,(long)(int)((uint)bVar1 - (uint)to_move),(ulong)bVar2,
             (long)(int)((uint)bVar3 + (uint)to_move),right,alloc);
  bVar4 = is_internal(this);
  if (bVar4) {
    for (local_29 = 0; local_29 < to_move; local_29 = local_29 + 1) {
      fVar5 = finish(this);
      pbVar6 = child(right,local_29);
      init_child(this,fVar5 + local_29 + '\x01',pbVar6);
    }
    for (local_2a = start(right); bVar1 = finish(right),
        (int)(uint)local_2a <= (int)((uint)bVar1 - (uint)to_move); local_2a = local_2a + 1) {
      bVar1 = max_count(right);
      if ((uint)bVar1 < (uint)local_2a + (uint)to_move) {
        __assert_fail("i + to_move <= right->max_count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x751,
                      "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>]"
                     );
      }
      pbVar6 = child(right,local_2a + to_move);
      init_child(right,local_2a,pbVar6);
      clear_child(right,local_2a + to_move);
    }
  }
  fVar5 = finish(this);
  set_finish(this,fVar5 + to_move);
  fVar5 = finish(right);
  set_finish(right,fVar5 - to_move);
  return;
}

Assistant:

void btree_node<P>::rebalance_right_to_left(field_type to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  transfer(finish(), position(), parent(), alloc);

  // 2) Move the (to_move - 1) values from the right node to the left node.
  transfer_n(to_move - 1, finish() + 1, right->start(), right, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  parent()->transfer(position(), right->start() + to_move - 1, right, alloc);

  // 4) Shift the values in the right node to their correct positions.
  right->transfer_n(right->count() - to_move, right->start(),
                    right->start() + to_move, right, alloc);

  if (is_internal()) {
    // Move the child pointers from the right to the left node.
    for (field_type i = 0; i < to_move; ++i) {
      init_child(finish() + i + 1, right->child(i));
    }
    for (field_type i = right->start(); i <= right->finish() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup `finish` on the left and right nodes.
  set_finish(finish() + to_move);
  right->set_finish(right->finish() - to_move);
}